

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::processError(CoreBroker *this,ActionMessage *command)

{
  bool bVar1;
  action_t aVar2;
  pointer pBVar3;
  pointer pBVar4;
  CoreBroker *in_RSI;
  long *in_RDI;
  bool in_stack_0000004b;
  int in_stack_0000004c;
  BrokerBase *in_stack_00000050;
  undefined1 in_stack_00000058 [16];
  GlobalFederateId in_stack_0000006c;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  fed;
  BasicBrokerInfo *brk;
  int in_stack_00000124;
  BrokerBase *in_stack_00000128;
  undefined1 in_stack_00000130 [16];
  undefined1 in_stack_00000190 [16];
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *this_00;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  *__lhs;
  BrokerBase *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  ActionMessage *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int32_t in_stack_ffffffffffffff24;
  GlobalFederateId local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  BaseType local_b4;
  string_view local_b0;
  undefined4 local_9c;
  undefined4 local_98;
  BaseType local_94;
  BasicFedInfo *local_90;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_88;
  BaseType local_7c;
  BasicBrokerInfo *local_78;
  string_view local_70;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  string_view local_50;
  BaseType local_3c;
  string_view local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  undefined4 in_stack_ffffffffffffffe8;
  BaseType BVar5;
  
  BVar5 = *(BaseType *)&(in_RSI->super_BrokerBase)._vptr_BrokerBase;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28);
  local_38 = SmallBuffer::to_string((SmallBuffer *)0x5ddcfd);
  this_00 = (DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
             *)local_38._M_len;
  __lhs = (__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
           *)local_38._M_str;
  BrokerBase::sendToLogger
            (in_stack_00000050,in_stack_0000006c,in_stack_0000004c,(string_view)in_stack_00000058,
             (string_view)in_stack_00000190,in_stack_0000004b);
  local_3c = *(BaseType *)((long)in_RDI + 0x14);
  bVar1 = GlobalFederateId::operator==
                    ((GlobalFederateId *)&in_RSI->super_BrokerBase,(GlobalBrokerId)local_3c);
  if (bVar1) {
    BrokerBase::setBrokerState(in_stack_fffffffffffffef8,(BrokerState)((ulong)__lhs >> 0x30));
    aVar2 = ActionMessage::action((ActionMessage *)in_RSI);
    if (aVar2 == cmd_global_error) {
      in_stack_ffffffffffffff18 = (ActionMessage *)(in_RDI + 1);
      in_stack_ffffffffffffff24 = *(int32_t *)((long)&(in_RSI->super_Broker)._vptr_Broker + 4);
      local_50 = SmallBuffer::to_string((SmallBuffer *)0x5dddd1);
      BrokerBase::setErrorState(in_stack_00000128,in_stack_00000124,(string_view)in_stack_00000130);
    }
    broadcast((CoreBroker *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
              in_stack_ffffffffffffff18);
    if ((*(byte *)((long)in_RDI + 0x29c) & 1) == 0) {
      ActionMessage::setAction((ActionMessage *)in_RSI,cmd_local_error);
      local_54 = 0;
      (**(code **)(*in_RDI + 0x118))(in_RDI,0,in_RSI);
    }
  }
  else {
    local_58 = 0;
    bVar1 = GlobalFederateId::operator==
                      ((GlobalFederateId *)&in_RSI->super_BrokerBase,(GlobalBrokerId)0x0);
    if (!bVar1) {
      local_5c = 1;
      bVar1 = GlobalFederateId::operator==
                        ((GlobalFederateId *)&in_RSI->super_BrokerBase,(GlobalBrokerId)0x1);
      if (!bVar1) {
        local_7c = (BaseType)
                   GlobalFederateId::operator_cast_to_GlobalBrokerId((GlobalFederateId *)this_00);
        local_78 = getBrokerById((CoreBroker *)
                                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                 (GlobalBrokerId)
                                 (BaseType)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        if (local_78 == (BasicBrokerInfo *)0x0) {
          local_88 = gmlc::containers::
                     DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                     ::find(in_stack_ffffffffffffff08,
                            (GlobalFederateId *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
          local_90 = (BasicFedInfo *)
                     gmlc::containers::
                     DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                     ::end(this_00);
          bVar1 = __gnu_cxx::
                  operator==<helics::BasicFedInfo_*,_const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                            (__lhs,(__normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                                    *)this_00);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            pBVar3 = __gnu_cxx::
                     __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                     ::operator->(&local_88);
            pBVar3->state = ERROR_STATE;
          }
        }
        else {
          local_78->state = ERROR_STATE;
        }
        aVar2 = ActionMessage::action((ActionMessage *)in_RSI);
        if ((aVar2 != cmd_error) && (aVar2 != cmd_local_error)) {
          if (aVar2 != cmd_global_error) {
            return;
          }
          local_b0 = SmallBuffer::to_string((SmallBuffer *)0x5de168);
          BrokerBase::setErrorState
                    (in_stack_00000128,in_stack_00000124,(string_view)in_stack_00000130);
          if ((*(byte *)((long)in_RDI + 0x29c) & 1) == 0) {
            local_b4 = *(BaseType *)((long)in_RDI + 0x14);
            bVar1 = GlobalFederateId::operator==
                              ((GlobalFederateId *)&(in_RSI->super_BrokerBase).global_id,
                               (GlobalBrokerId)local_b4);
            if (!bVar1) {
              local_b8 = 0;
              bVar1 = GlobalFederateId::operator==
                                ((GlobalFederateId *)&(in_RSI->super_BrokerBase).global_id,
                                 (GlobalBrokerId)0x0);
              if (!bVar1) {
                local_bc = 0;
                (**(code **)(*in_RDI + 0x110))(in_RDI,0,in_RSI);
                return;
              }
            }
          }
          GlobalFederateId::GlobalFederateId
                    (&local_c0,(GlobalBrokerId)*(BaseType *)((long)in_RDI + 0x14));
          *(BaseType *)&(in_RSI->super_BrokerBase)._vptr_BrokerBase = local_c0.gid;
          broadcast((CoreBroker *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff18);
          return;
        }
        if ((*(byte *)((long)in_RDI + 0xda) & 1) != 0) {
          ActionMessage::setAction((ActionMessage *)in_RSI,cmd_global_error);
          processError(in_RSI,(ActionMessage *)CONCAT44(BVar5,in_stack_ffffffffffffffe8));
          return;
        }
        if ((*(byte *)((long)in_RDI + 0x29c) & 1) == 0) {
          local_94 = *(BaseType *)((long)in_RDI + 0x14);
          bVar1 = GlobalFederateId::operator==
                            ((GlobalFederateId *)&(in_RSI->super_BrokerBase).global_id,
                             (GlobalBrokerId)local_94);
          if (!bVar1) {
            local_98 = 0;
            bVar1 = GlobalFederateId::operator==
                              ((GlobalFederateId *)&(in_RSI->super_BrokerBase).global_id,
                               (GlobalBrokerId)0x0);
            if (!bVar1) {
              local_9c = 0;
              (**(code **)(*in_RDI + 0x110))(in_RDI,0,in_RSI);
            }
          }
        }
        if ((*(byte *)((long)in_RDI + 0x211) & 1) == 0) {
          return;
        }
        pBVar4 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x5de124);
        (*pBVar4->_vptr_BaseTimeCoordinator[3])(pBVar4,in_RSI);
        return;
      }
    }
    BrokerBase::setBrokerState(in_stack_fffffffffffffef8,(BrokerState)((ulong)__lhs >> 0x30));
    aVar2 = ActionMessage::action((ActionMessage *)in_RSI);
    if (aVar2 == cmd_global_error) {
      local_70 = SmallBuffer::to_string((SmallBuffer *)0x5ddf0c);
      BrokerBase::setErrorState(in_stack_00000128,in_stack_00000124,(string_view)in_stack_00000130);
    }
    broadcast((CoreBroker *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
              in_stack_ffffffffffffff18);
  }
  return;
}

Assistant:

void CoreBroker::processError(ActionMessage& command)
{
    sendToLogger(command.source_id,
                 LogLevels::ERROR_LEVEL,
                 std::string_view(),
                 command.payload.to_string());
    if (command.source_id == global_broker_id_local) {
        setBrokerState(BrokerState::ERRORED);
        if (command.action() == CMD_GLOBAL_ERROR) {
            setErrorState(command.messageID, command.payload.to_string());
        }
        broadcast(command);
        if (!isRootc) {
            command.setAction(CMD_LOCAL_ERROR);
            transmit(parent_route_id, std::move(command));
        }
        return;
    }

    if (command.source_id == parent_broker_id || command.source_id == gRootBrokerID) {
        setBrokerState(BrokerState::ERRORED);
        if (command.action() == CMD_GLOBAL_ERROR) {
            setErrorState(command.messageID, command.payload.to_string());
        }
        broadcast(command);
        return;
    }

    auto* brk = getBrokerById(GlobalBrokerId{command.source_id});
    if (brk == nullptr) {
        auto fed = mFederates.find(command.source_id);
        if (fed != mFederates.end()) {
            fed->state = ConnectionState::ERROR_STATE;
        }
    } else {
        brk->state = ConnectionState::ERROR_STATE;
    }

    switch (command.action()) {
        case CMD_LOCAL_ERROR:
        case CMD_ERROR:
            if (terminate_on_error) {
                // upgrade the error to a global error and reprocess
                command.setAction(CMD_GLOBAL_ERROR);
                processError(command);
                return;
            }
            if (!(isRootc || command.dest_id == global_broker_id_local ||
                  command.dest_id == parent_broker_id)) {
                transmit(parent_route_id, command);
            }
            if (hasTimeDependency) {
                timeCoord->processTimeMessage(command);
            }
            break;
        case CMD_GLOBAL_ERROR:
            setErrorState(command.messageID, command.payload.to_string());
            if (!(isRootc || command.dest_id == global_broker_id_local ||
                  command.dest_id == parent_broker_id)) {
                transmit(parent_route_id, command);
            } else {
                command.source_id = global_broker_id_local;
                broadcast(command);
            }
            break;
        default:
            break;
    }
}